

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

QJsonValue * __thiscall
QJsonValueConstRef::concrete
          (QJsonValue *__return_storage_ptr__,QJsonValueConstRef *this,QJsonValueConstRef self)

{
  QJsonValue *result;
  long in_FS_OFFSET;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborContainerPrivate::valueAt
            (&local_30,(QCborContainerPrivate *)(this->field_0).a,
             (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1));
  *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonValue::QJsonValue(__return_storage_ptr__,Null);
  QCborValue::operator=((QCborValue *)__return_storage_ptr__,&local_30);
  QCborValue::~QCborValue((QCborValue *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonValueConstRef::concrete(QJsonValueConstRef self) noexcept
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    return QJsonPrivate::Value::fromTrustedCbor(d->valueAt(index));
}